

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::IsInPackage
          (DescriptorBuilder *this,FileDescriptor *file,string *package_name)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  string *psVar4;
  char *pcVar5;
  FileDescriptor *in_RSI;
  string *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  bool bVar6;
  
  FileDescriptor::package_abi_cxx11_(in_RSI);
  bVar1 = HasPrefixString((string *)
                          CONCAT17(in_stack_ffffffffffffffe7,
                                   CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),
                          in_stack_ffffffffffffffd8);
  bVar6 = false;
  if (bVar1) {
    FileDescriptor::package_abi_cxx11_(in_RSI);
    lVar2 = std::__cxx11::string::size();
    lVar3 = std::__cxx11::string::size();
    bVar6 = true;
    if (lVar2 != lVar3) {
      psVar4 = FileDescriptor::package_abi_cxx11_(in_RSI);
      std::__cxx11::string::size();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
      bVar6 = *pcVar5 == '.';
    }
  }
  return bVar6;
}

Assistant:

bool DescriptorBuilder::IsInPackage(const FileDescriptor* file,
                                    const std::string& package_name) {
  return HasPrefixString(file->package(), package_name) &&
         (file->package().size() == package_name.size() ||
          file->package()[package_name.size()] == '.');
}